

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

MaterialPackage * __thiscall
ASDCP::MXF::MaterialPackage::InitFromTLVSet(MaterialPackage *this,TLVReader *TLVSet)

{
  MDDEntry *Object;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    GenericPackage::InitFromTLVSet(&this->super_GenericPackage,TLVSet);
    if (-1 < *(int *)&(this->super_GenericPackage).super_InterchangeObject.super_KLVPacket.
                      _vptr_KLVPacket) {
      Object = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_MaterialPackage_PackageMarker);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)Object);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      *(bool *)&TLVSet[5].super_MemIOReader.m_capacity =
           *(int *)&(this->super_GenericPackage).super_InterchangeObject.super_KLVPacket.
                    _vptr_KLVPacket == Kumu::RESULT_OK;
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x235,
                "virtual ASDCP::Result_t ASDCP::MXF::MaterialPackage::InitFromTLVSet(TLVReader &)");
}

Assistant:

ASDCP::Result_t
MaterialPackage::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = GenericPackage::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(MaterialPackage, PackageMarker));
    PackageMarker.set_has_value( result == RESULT_OK );
  }
  return result;
}